

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plytool.cpp
# Opt level: O0

int info(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *args)

{
  Point3<float> p_00;
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  char *fmt;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  reference piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool *pbVar7;
  reference pPVar8;
  reference rVar9;
  reference rVar10;
  reference rVar11;
  Point3f p;
  iterator __end2_2;
  iterator __begin2_2;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range2_2;
  Bounds3f bounds;
  size_t i;
  int v_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int v;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<bool,_std::allocator<bool>_> vertexUsed;
  TriQuadMesh mesh;
  string filename;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd68;
  _Bit_type in_stack_fffffffffffffd70;
  _Bit_type *in_stack_fffffffffffffd78;
  bool *in_stack_fffffffffffffd80;
  _Bit_type in_stack_fffffffffffffd88;
  _Bit_type *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffdb0;
  undefined1 *puVar12;
  int iVar13;
  string *this;
  undefined8 in_stack_fffffffffffffdd0;
  LogLevel LVar14;
  Bounds3<float> *local_210;
  __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  local_1e0;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *local_1d8;
  Bounds3<float> *in_stack_fffffffffffffe30;
  _Bit_type *in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe50;
  bool *local_1a8;
  reference local_1a0;
  int local_18c;
  int *local_188;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  vector<int,_std::allocator<int>_> *local_178;
  reference local_170;
  int local_15c;
  int *local_158;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_150;
  vector<int,_std::allocator<int>_> *local_148;
  undefined1 local_13a;
  undefined1 local_139;
  size_type local_110;
  size_type local_108;
  size_type local_100;
  size_type local_f8;
  ulong local_f0;
  ulong local_e8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_d0;
  string *in_stack_ffffffffffffff58;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd68);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd68);
  rVar10._M_mask = in_stack_fffffffffffffd88;
  rVar10._M_p = in_stack_fffffffffffffd90;
  rVar11._M_mask = in_stack_fffffffffffffd70;
  rVar11._M_p = in_stack_fffffffffffffd78;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)rVar11._M_mask,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) {
      return 0;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_18);
    this = local_40;
    std::__cxx11::string::string(this,(string *)pbVar2);
    pbrt::TriQuadMesh::ReadPLY(in_stack_ffffffffffffff58);
    pbrt::Printf<std::__cxx11::string&>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_70);
    local_e8 = sVar3 / 3;
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_58);
    local_f0 = sVar3 >> 2;
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    local_f8 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_d0);
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    local_100 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                          ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                           &stack0xffffffffffffff48);
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    local_108 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                          (&local_a0);
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    local_110 = std::vector<int,_std::allocator<int>_>::size(&local_88);
    pbrt::Printf<unsigned_long>
              (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
    fmt = (char *)std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                            (&local_d0);
    local_139 = 0;
    puVar12 = &local_13a;
    std::allocator<bool>::allocator((allocator<bool> *)0x43fbc2);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)rVar10._M_p,rVar10._M_mask,
               in_stack_fffffffffffffd80,(allocator_type *)rVar11._M_p);
    std::allocator<bool>::~allocator((allocator<bool> *)0x43fbf0);
    local_148 = &local_70;
    local_150._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd68);
    local_158 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffd68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         rVar11._M_mask,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffd68);
      if (!bVar1) break;
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_150);
      LVar14 = (LogLevel)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      iVar13 = (int)((ulong)puVar12 >> 0x20);
      local_15c = *piVar5;
      if (local_15c < 0) {
LAB_0043fc97:
        pbrt::LogFatal<char_const(&)[28]>
                  (LVar14,(char *)this,iVar13,fmt,(char (*) [28])in_stack_fffffffffffffdb0);
      }
      in_stack_fffffffffffffdb0 = (vector<bool,_std::allocator<bool>_> *)(long)local_15c;
      pvVar4 = (vector<bool,_std::allocator<bool>_> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_d0);
      LVar14 = (LogLevel)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      iVar13 = (int)((ulong)puVar12 >> 0x20);
      if (pvVar4 <= in_stack_fffffffffffffdb0) goto LAB_0043fc97;
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)rVar10._M_p,rVar10._M_mask);
      in_stack_fffffffffffffda0 = (char *)rVar9._M_mask;
      local_170 = rVar9;
      std::_Bit_reference::operator=(&local_170,true);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_150);
    }
    local_178 = &local_58;
    local_180._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd68);
    local_188 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffd68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         rVar11._M_mask,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffd68);
      if (!bVar1) break;
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_180);
      LVar14 = (LogLevel)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      iVar13 = (int)((ulong)puVar12 >> 0x20);
      local_18c = *piVar5;
      if (local_18c < 0) {
LAB_0043fe3d:
        pbrt::LogFatal<char_const(&)[28]>
                  (LVar14,(char *)this,iVar13,fmt,(char (*) [28])in_stack_fffffffffffffdb0);
      }
      in_stack_fffffffffffffd98 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_18c;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_d0);
      LVar14 = (LogLevel)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      iVar13 = (int)((ulong)puVar12 >> 0x20);
      if (pbVar6 <= in_stack_fffffffffffffd98) goto LAB_0043fe3d;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)rVar10._M_p,rVar10._M_mask);
      local_1a0 = rVar10;
      std::_Bit_reference::operator=(&local_1a0,true);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_180);
    }
    local_1a8 = (bool *)0x0;
    while( true ) {
      in_stack_fffffffffffffd80 = local_1a8;
      pbVar7 = (bool *)std::vector<bool,_std::allocator<bool>_>::size(in_stack_fffffffffffffdb0);
      if (pbVar7 <= in_stack_fffffffffffffd80) break;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)rVar10._M_p,rVar10._M_mask);
      in_stack_fffffffffffffe48 = rVar11._M_p;
      in_stack_fffffffffffffe50 = (float)rVar11._M_mask;
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xfffffffffffffe48)
      ;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pbrt::Printf<unsigned_long&>
                  (in_stack_fffffffffffffda0,(unsigned_long *)in_stack_fffffffffffffd98);
      }
      local_1a8 = local_1a8 + 1;
    }
    pbrt::Bounds3<float>::Bounds3((Bounds3<float> *)rVar10._M_p);
    local_1d8 = &local_d0;
    local_1e0._M_current =
         (Point3<float> *)
         std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                   ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                    in_stack_fffffffffffffd68);
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
              ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
               in_stack_fffffffffffffd68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                          *)rVar11._M_mask,
                         (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                          *)in_stack_fffffffffffffd68);
      if (!bVar1) break;
      pPVar8 = __gnu_cxx::
               __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
               ::operator*(&local_1e0);
      in_stack_fffffffffffffdd0._0_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).x;
      in_stack_fffffffffffffdd0._4_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).y;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe50;
      p_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffe48;
      pbrt::Union<float>(in_stack_fffffffffffffe30,p_00);
      in_stack_fffffffffffffe30 = local_210;
      __gnu_cxx::
      __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
      ::operator++(&local_1e0);
    }
    pbrt::Printf<pbrt::Bounds3<float>&>
              (in_stack_fffffffffffffda0,(Bounds3<float> *)in_stack_fffffffffffffd98);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x4400bd);
    pbrt::TriQuadMesh::~TriQuadMesh((TriQuadMesh *)rVar11._M_mask);
    std::__cxx11::string::~string(local_40);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_18);
  } while( true );
}

Assistant:

int info(std::vector<std::string> args) {
    for (std::string filename : args) {
        TriQuadMesh mesh = TriQuadMesh::ReadPLY(filename);

        Printf("%s:\n", filename);
        Printf("\tTriangles: %d\n", mesh.triIndices.size() / 3);
        Printf("\tQuads: %d\n", mesh.quadIndices.size() / 4);
        Printf("\tVertex positions: %d\n", mesh.p.size());
        Printf("\tVertex normals: %d\n", mesh.n.size());
        Printf("\tVertex uvs: %d\n", mesh.uv.size());
        Printf("\tFace indices: %d\n", mesh.faceIndices.size());

        std::vector<bool> vertexUsed(mesh.p.size(), false);
        for (int v : mesh.triIndices) {
            CHECK(v >= 0 && v < mesh.p.size());
            vertexUsed[v] = true;
        }
        for (int v : mesh.quadIndices) {
            CHECK(v >= 0 && v < mesh.p.size());
            vertexUsed[v] = true;
        }
        for (size_t i = 0; i < vertexUsed.size(); ++i)
            if (!vertexUsed[i])
                Printf("Notice: vertex %d is not used.\n", i);

        Bounds3f bounds;
        for (Point3f p : mesh.p)
            bounds = Union(bounds, p);
        Printf("\tBounding box: %s\n", bounds);
    }

    return 0;
}